

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

half tinyusdz::value::float_to_half_full(float _f)

{
  ushort uVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = (uint)_f >> 0x17;
  cVar2 = (char)uVar3;
  if (cVar2 == '\0') {
    uVar1 = 0;
    goto LAB_002b0c79;
  }
  uVar4 = uVar3 & 0xff;
  if (uVar4 == 0xff) {
    uVar1 = (((uint)_f & 0x7fffff) != 0 | 0x3e) << 9;
    goto LAB_002b0c79;
  }
  uVar1 = 0x7c00;
  if (uVar4 < 0x8f) {
    if (uVar4 < 0x71) {
      if (uVar4 < 0x66) {
        uVar1 = 0;
        goto LAB_002b0c74;
      }
      uVar3 = (uint)_f & 0x7fffff | 0x800000;
      uVar1 = (ushort)(uVar3 >> (0x7eU - cVar2 & 0x1f)) & 0x3ff;
      uVar3 = uVar3 >> ((byte)(0x7d - cVar2) & 0x1f);
    }
    else {
      uVar1 = ((ushort)((uint)_f >> 0xd) & 0x3ff | (ushort)((uVar3 & 0x1f) << 10)) ^ 0x4000;
      uVar3 = (uint)_f >> 0xc;
    }
    uVar1 = uVar1 + ((uVar3 & 1) != 0);
  }
LAB_002b0c74:
  uVar1 = uVar1 & 0x7fff;
LAB_002b0c79:
  return (half)(uVar1 | (ushort)((uint)_f >> 0x10) & 0x8000);
}

Assistant:

half float_to_half_full_le(float _f) {
  FP32le f;
  f.f = _f;
  float16le o = {0};

  // Based on ISPC reference code (with minor modifications)
  if (f.s.Exponent == 0)  // Signed zero/denormal (which will underflow)
    o.s.Exponent = 0;
  else if (f.s.Exponent == 255)  // Inf or NaN (all exponent bits set)
  {
    o.s.Exponent = 31;
    o.s.Mantissa = f.s.Mantissa ? 0x200 : 0;  // NaN->qNaN and Inf->Inf
  } else                                      // Normalized number
  {
    // Exponent unbias the single, then bias the halfp
    int newexp = f.s.Exponent - 127 + 15;
    if (newexp >= 31)  // Overflow, return signed infinity
      o.s.Exponent = 31;
    else if (newexp <= 0)  // Underflow
    {
      if ((14 - newexp) <= 24)  // Mantissa might be non-zero
      {
        unsigned int mant = f.s.Mantissa | 0x800000;  // Hidden 1 bit
        o.s.Mantissa = mant >> (14 - newexp);
        if ((mant >> (13 - newexp)) & 1)  // Check for rounding
          o.u++;  // Round, might overflow into exp bit, but this is OK
      }
    } else {
      o.s.Exponent = static_cast<unsigned int>(newexp);
      o.s.Mantissa = f.s.Mantissa >> 13;
      if (f.s.Mantissa & 0x1000)  // Check for rounding
        o.u++;                    // Round, might overflow to inf, this is OK
    }
  }

  o.s.Sign = f.s.Sign;

  half ret;
  ret.value = (*reinterpret_cast<const uint16_t *>(&o));
  return ret;
}